

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

void __thiscall
mkvparser::ContentEncoding::ContentEncryption::ContentEncryption(ContentEncryption *this)

{
  this->sig_key_id_len = 0;
  this->sig_algo = 0;
  this->signature_len = 0;
  this->sig_key_id = (uchar *)0x0;
  this->key_id_len = 0;
  this->signature = (uchar *)0x0;
  this->algo = 0;
  this->key_id = (uchar *)0x0;
  this->sig_hash_algo = 0;
  (this->aes_settings).cipher_mode = 1;
  return;
}

Assistant:

ContentEncoding::ContentEncryption::ContentEncryption()
    : algo(0),
      key_id(NULL),
      key_id_len(0),
      signature(NULL),
      signature_len(0),
      sig_key_id(NULL),
      sig_key_id_len(0),
      sig_algo(0),
      sig_hash_algo(0) {}